

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

Llb_Mnx_t * Llb_MnxStart(Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  int iVar1;
  Llb_Mnx_t *pLVar2;
  abctime aVar3;
  DdManager *pDVar4;
  Vec_Int_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  long local_28;
  Llb_Mnx_t *p;
  Gia_ParLlb_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  pLVar2 = (Llb_Mnx_t *)calloc(1,0x80);
  pLVar2->pAig = pAig;
  pLVar2->pPars = pPars;
  if (pLVar2->pPars->TimeLimit == 0) {
    local_28 = 0;
  }
  else {
    iVar1 = pLVar2->pPars->TimeLimit;
    aVar3 = Abc_Clock();
    local_28 = (long)iVar1 * 1000000 + aVar3;
  }
  pLVar2->pPars->TimeTarget = local_28;
  if (pPars->fCluster == 0) {
    pVVar5 = Llb_Nonlin4CreateOrder(pAig);
    pLVar2->vOrder = pVVar5;
    iVar1 = Vec_IntCountPositive(pLVar2->vOrder);
    pDVar4 = Cudd_Init(iVar1 + 1,0,0x100,0x40000,0);
    pLVar2->dd = pDVar4;
    Cudd_AutodynEnable(pLVar2->dd,CUDD_REORDER_SYMM_SIFT);
    Cudd_SetMaxGrowth(pLVar2->dd,1.05);
    pLVar2->dd->TimeStop = pLVar2->pPars->TimeTarget;
    pVVar6 = Llb_Nonlin4DerivePartitions(pLVar2->dd,pAig,pLVar2->vOrder);
    pLVar2->vRoots = pVVar6;
  }
  else {
    Llb4_Nonlin4Sweep(pLVar2->pAig,pPars->nBddMax,pPars->nClusterMax,&pLVar2->dd,&pLVar2->vOrder,
                      &pLVar2->vRoots,pPars->fVerbose);
    pLVar2->dd->TimeStop = pLVar2->pPars->TimeTarget;
  }
  Llb_Nonlin4SetupVarMap(pLVar2->dd,pAig,pLVar2->vOrder);
  pVVar5 = Llb_Nonlin4CreateVars2Q(pLVar2->dd,pAig,pLVar2->vOrder,pLVar2->pPars->fBackward);
  pLVar2->vVars2Q = pVVar5;
  pVVar6 = Vec_PtrAlloc(100);
  pLVar2->vRings = pVVar6;
  if (pPars->fReorder != 0) {
    Llb_Nonlin4Reorder(pLVar2->dd,0,1);
  }
  return pLVar2;
}

Assistant:

Llb_Mnx_t * Llb_MnxStart( Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    Llb_Mnx_t * p;

    p = ABC_CALLOC( Llb_Mnx_t, 1 );
    p->pAig    = pAig;
    p->pPars   = pPars;

    // compute time to stop
    p->pPars->TimeTarget = p->pPars->TimeLimit ? p->pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    if ( pPars->fCluster )
    {
//        Llb_Nonlin4Cluster( p->pAig, &p->dd, &p->vOrder, &p->vRoots, pPars->nBddMax, pPars->fVerbose );
//        Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
        Llb4_Nonlin4Sweep( p->pAig, pPars->nBddMax, pPars->nClusterMax, &p->dd, &p->vOrder, &p->vRoots, pPars->fVerbose );
        // set the stop time parameter
        p->dd->TimeStop  = p->pPars->TimeTarget;
    }
    else
    {
//    p->vOrder  = Llb_Nonlin4CreateOrderSimple( pAig );
        p->vOrder  = Llb_Nonlin4CreateOrder( pAig );
        p->dd      = Cudd_Init( Vec_IntCountPositive(p->vOrder) + 1, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
        Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
        Cudd_SetMaxGrowth( p->dd, 1.05 );
        // set the stop time parameter
        p->dd->TimeStop  = p->pPars->TimeTarget;
        p->vRoots  = Llb_Nonlin4DerivePartitions( p->dd, pAig, p->vOrder );
    }

    Llb_Nonlin4SetupVarMap( p->dd, pAig, p->vOrder );
    p->vVars2Q = Llb_Nonlin4CreateVars2Q( p->dd, pAig, p->vOrder, p->pPars->fBackward );
    p->vRings  = Vec_PtrAlloc( 100 );

    if ( pPars->fReorder )
        Llb_Nonlin4Reorder( p->dd, 0, 1 );
    return p;
}